

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::DGLLVMPointerAnalysisImpl
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *this,PointerGraph *PS,
          LLVMPointerGraphBuilder *b,LLVMPointerAnalysisOptions *opts)

{
  undefined8 in_RDX;
  PointerAnalysisOptions *in_RSI;
  PointerGraph *in_RDI;
  PointerAnalysisFS *unaff_retaddr;
  PointerGraph *ps;
  
  ps = in_RDI;
  PointerAnalysisOptions::PointerAnalysisOptions((PointerAnalysisOptions *)in_RDI,in_RSI);
  pta::PointerAnalysisFS::PointerAnalysisFS(unaff_retaddr,ps,in_RSI);
  PointerAnalysisOptions::~PointerAnalysisOptions((PointerAnalysisOptions *)0x16a47b);
  *(undefined ***)in_RDI = &PTR__DGLLVMPointerAnalysisImpl_001978d8;
  *(undefined8 *)&((_Rb_tree_header *)&in_RDI[1]._entry)->_M_header = in_RDX;
  return;
}

Assistant:

DGLLVMPointerAnalysisImpl(PointerGraph *PS, LLVMPointerGraphBuilder *b,
                              const LLVMPointerAnalysisOptions &opts)
            : PTType(PS, opts), builder(b) {}